

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OutputStream.cpp
# Opt level: O0

bool anon_unknown.dwarf_1c551::check_and_create_directory(path *filepath)

{
  bool bVar1;
  ostream *poVar2;
  basic_ostream<char,_std::char_traits<char>_> *this;
  filesystem_error *e;
  byte local_51;
  int local_50;
  bool result;
  undefined1 local_40 [8];
  path parent;
  path *filepath_local;
  
  parent._32_8_ = filepath;
  std::filesystem::__cxx11::path::parent_path();
  bVar1 = std::filesystem::__cxx11::path::empty((path *)local_40);
  if (bVar1) {
    filepath_local._7_1_ = 1;
    local_50 = 1;
  }
  else {
    local_51 = std::filesystem::create_directories((path *)local_40);
    local_51 = local_51 & 1;
    if (local_51 != 0) {
      cali::Log::Log((Log *)&e,2);
      poVar2 = cali::Log::stream((Log *)&e);
      poVar2 = std::operator<<(poVar2,"OutputStream: created directories for ");
      this = std::filesystem::__cxx11::operator<<(poVar2,(path *)parent._32_8_);
      std::ostream::operator<<(this,std::endl<char,std::char_traits<char>>);
      cali::Log::~Log((Log *)&e);
    }
    local_50 = 0;
  }
  std::filesystem::__cxx11::path::~path((path *)local_40);
  if (local_50 == 0) {
    filepath_local._7_1_ = 1;
  }
  return (bool)(filepath_local._7_1_ & 1);
}

Assistant:

bool check_and_create_directory(const std::filesystem::path& filepath)
{
    try {
        auto parent = filepath.parent_path();
        if (parent.empty())
            return true;
        bool result = std::filesystem::create_directories(parent);
        if (result) {
            Log(2).stream() << "OutputStream: created directories for " << filepath << std::endl;
        }
    } catch (std::filesystem::filesystem_error const& e) {
        Log(0).stream() << "OutputStream: create_directories failed: " << e.what() << std::endl;
        return false;
    }
    return true;
}